

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImRect IVar7;
  ImGuiContext *pIVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  ImGuiID id;
  char *pcVar14;
  byte *pbVar15;
  char cVar16;
  byte bVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  char cVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ImGuiTableColumn *pIVar28;
  ImGuiTableColumn *pIVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 extraout_var [60];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined4 uVar45;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint local_a8;
  ImRect local_40;
  
  pIVar8 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x2ab,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar12 = table->Flags;
  uVar19 = table->ColumnsCount;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  auVar40 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(pIVar8->Style).FramePadding.x))
  ;
  table->MinColumnWidth = auVar40._0_4_;
  bVar11 = false;
  uVar13 = uVar12;
  if ((int)uVar19 < 1) {
    uVar21 = 0xffffffff;
    local_c8 = ZEXT816(0) << 0x20;
    bVar30 = false;
    fVar32 = 0.0;
    cVar9 = '\0';
    local_b8 = local_c8;
  }
  else {
    iVar20 = 0;
    uVar21 = 0xffffffff;
    uVar26 = 0;
    cVar9 = '\0';
    bVar30 = false;
    bVar11 = false;
    local_b8 = ZEXT816(0);
    local_c8 = ZEXT816(0);
    do {
      pcVar14 = (table->DisplayOrderToIndex).Data + uVar26;
      if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_001975b5;
      cVar23 = *pcVar14;
      uVar19 = (uint)cVar23;
      if (uVar26 != uVar19) {
        table->IsDefaultDisplayOrder = false;
      }
      if ((cVar23 < '\0') ||
         (pIVar28 = (table->Columns).Data + cVar23, (table->Columns).DataEnd <= pIVar28))
      goto LAB_0019759e;
      if (table->DeclColumnsCount <= cVar23) {
        TableSetupColumnFlags(table,pIVar28,0);
        pIVar28->NameOffset = -1;
        pIVar28->UserID = 0;
        pIVar28->InitStretchWeightOrWidth = -1.0;
        uVar13 = table->Flags;
      }
      if (((uVar13 & 4) == 0) || ((pIVar28->Flags & 0x40) != 0)) {
        pIVar28->IsEnabledNextFrame = true;
        bVar10 = true;
      }
      else {
        bVar10 = pIVar28->IsEnabledNextFrame;
      }
      if (pIVar28->IsEnabled == bVar10) {
        cVar16 = pIVar28->SortOrder;
      }
      else {
        pIVar28->IsEnabled = bVar10;
        table->IsSettingsDirty = true;
        cVar16 = pIVar28->SortOrder;
        if (cVar16 != -1 && (bVar10 & 1U) == 0) {
          table->IsSortSpecsDirty = true;
        }
      }
      if (((uVar13 >> 0x1a & 1) == 0) && ('\0' < cVar16)) {
        table->IsSortSpecsDirty = true;
      }
      uVar2 = pIVar28->Flags;
      if ((&pIVar28->WidthRequest)[(ulong)((uVar2 & 8) == 0) * 2] < 0.0) {
        pIVar28->AutoFitQueue = '\a';
        pIVar28->CannotSkipItemsQueue = '\a';
      }
      if ((bVar10 & 1U) == 0) {
        pIVar28->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar28->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar21;
        pIVar28->NextEnabledColumn = -1;
        if (uVar21 == 0xffffffff) {
          table->LeftMostEnabledColumn = cVar23;
        }
        else {
          if (((int)uVar21 < 0) ||
             (pIVar29 = (table->Columns).Data + (int)uVar21, (table->Columns).DataEnd <= pIVar29))
          goto LAB_0019759e;
          pIVar29->NextEnabledColumn = cVar23;
        }
        cVar23 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar23 + '\x01';
        pIVar28->IndexWithinEnabledSet = cVar23;
        cVar16 = pIVar28->DisplayOrder;
        auVar40 = vpunpcklqdq_avx(ZEXT416((uint)(int)cVar16),ZEXT416(uVar19));
        auVar34._8_8_ = 1;
        auVar34._0_8_ = 1;
        auVar34 = vpsllvq_avx2(auVar34,auVar40);
        auVar40._0_8_ = table->EnabledMaskByDisplayOrder;
        auVar40._8_8_ = table->EnabledMaskByIndex;
        auVar40 = vpor_avx(auVar34,auVar40);
        table->EnabledMaskByDisplayOrder = auVar40._0_8_;
        table->EnabledMaskByIndex = auVar40._8_8_;
        if (cVar16 < cVar23) {
          __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x2f3,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar28->IsPreserveWidthAuto == false) {
          fVar32 = TableGetColumnWidthAuto(table,pIVar28);
          pIVar28->WidthAuto = fVar32;
        }
        if ((uVar2 & 0x10) == 0) {
          bVar11 = true;
        }
        if ((((uVar2 & 8) != 0) && ((uVar2 & 0x10) != 0)) &&
           (0.0 < pIVar28->InitStretchWeightOrWidth)) {
          pIVar28->WidthAuto = pIVar28->InitStretchWeightOrWidth;
        }
        bVar30 = (bool)(bVar30 | pIVar28->AutoFitQueue != '\0');
        fVar32 = pIVar28->WidthAuto;
        uVar21 = uVar19;
        if ((uVar2 & 4) == 0) {
          auVar40 = vcmpss_avx(ZEXT416((uint)fVar32),local_c8,2);
          local_c8 = vblendvps_avx(ZEXT416((uint)fVar32),local_c8,auVar40);
          cVar9 = cVar9 + '\x01';
        }
        else {
          local_b8 = ZEXT416((uint)((float)local_b8._0_4_ + fVar32));
          iVar20 = iVar20 + 1;
        }
      }
      uVar26 = uVar26 + 1;
      uVar19 = table->ColumnsCount;
    } while ((long)uVar26 < (long)(int)uVar19);
    fVar32 = (float)iVar20;
  }
  if ((((uVar13 & 8) != 0) && ((uVar13 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar21;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar21 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x311,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar30) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  uVar26 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    fVar43 = 0.0;
    bVar30 = true;
    fVar37 = 0.0;
  }
  else {
    uVar27 = table->EnabledMaskByIndex;
    uVar24 = 0xff;
    lVar22 = 0x62;
    uVar18 = 0;
    uVar25 = 0xff;
    fVar37 = 0.0;
    fVar43 = 0.0;
    do {
      bVar17 = (byte)uVar18;
      if ((uVar27 >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data;
        pIVar29 = (ImGuiTableColumn *)((long)pIVar28 + lVar22 + -0x62);
        if ((table->Columns).DataEnd <= pIVar29) goto LAB_0019759e;
        uVar21 = pIVar29->Flags;
        if ((uVar21 & 8) == 0) {
          if ((((uVar21 & 0x10) != 0) || (*(char *)((long)&pIVar28->Flags + lVar22) != '\0')) ||
             (fVar39 = *(float *)((long)pIVar28 + lVar22 + -0x4a), fVar39 < 0.0)) {
            fVar39 = *(float *)((long)pIVar28 + lVar22 + -0x46);
            bVar30 = fVar39 <= 0.0;
            if (fVar39 <= 0.0) {
              fVar39 = 1.0;
            }
            if (bVar30 && (uVar12 & 0xe000) == 0x6000) {
              fVar39 = (*(float *)((long)pIVar28 + lVar22 + -0x4e) / (float)local_b8._0_4_) * fVar32
              ;
            }
            *(float *)((long)pIVar28 + lVar22 + -0x4a) = fVar39;
          }
          cVar23 = (char)uVar25;
          if (cVar23 == -1) {
LAB_00196bc4:
            table->LeftMostStretchedColumn = bVar17;
            uVar25 = uVar18 & 0xffffffff;
          }
          else {
            if ((cVar23 < '\0') || ((table->Columns).DataEnd <= pIVar28 + cVar23))
            goto LAB_0019759e;
            if (*(char *)((long)pIVar28 + lVar22 + -0x10) < pIVar28[cVar23].DisplayOrder)
            goto LAB_00196bc4;
          }
          fVar43 = fVar43 + fVar39;
          cVar23 = (char)uVar24;
          if (cVar23 != -1) {
            if ((cVar23 < '\0') || ((table->Columns).DataEnd <= pIVar28 + cVar23))
            goto LAB_0019759e;
            if (*(char *)((long)pIVar28 + lVar22 + -0x10) <= pIVar28[cVar23].DisplayOrder)
            goto LAB_00196c9b;
          }
          table->RightMostStretchedColumn = bVar17;
          uVar24 = uVar18 & 0xffffffff;
        }
        else {
          cVar23 = *(char *)((long)&pIVar28->Flags + lVar22);
          auVar34 = ZEXT416(*(uint *)((long)pIVar28 + lVar22 + -0x4e));
          auVar40 = local_c8;
          if (cVar23 == '\0') {
            auVar40 = auVar34;
          }
          auVar36 = local_c8;
          if ((uVar21 & 0x10) == 0) {
            auVar36 = auVar40;
          }
          if ((uVar12 & 0xe000) != 0x4000) {
            auVar36 = auVar34;
          }
          if (cVar23 == '\0') {
            if (((uVar21 & 0x10) != 0) &&
               ((table->RequestOutputMaskByIndex & 1L << (bVar17 & 0x3f)) != 0)) goto LAB_00196c8d;
          }
          else {
            *(int *)((long)pIVar28 + lVar22 + -0x52) = auVar36._0_4_;
            if ((cVar23 != '\x01') &&
               ((table->IsInitializing == true && (*(char *)((long)pIVar28 + lVar22 + -2) == '\0')))
               ) {
              auVar34 = ZEXT416((uint)(table->MinColumnWidth * 4.0));
              auVar40 = vcmpss_avx(auVar34,auVar36,2);
              auVar36 = vblendvps_avx(auVar34,auVar36,auVar40);
LAB_00196c8d:
              *(int *)((long)pIVar28 + lVar22 + -0x52) = auVar36._0_4_;
            }
          }
          fVar37 = fVar37 + *(float *)((long)pIVar28 + lVar22 + -0x52);
        }
LAB_00196c9b:
        *(undefined1 *)((long)pIVar28 + lVar22 + -2) = 0;
        fVar37 = table->CellPaddingX + table->CellPaddingX + fVar37;
      }
      uVar18 = uVar18 + 1;
      lVar22 = lVar22 + 0x68;
    } while (uVar26 != uVar18);
    bVar30 = (char)uVar25 == -1;
  }
  table->ColumnsEnabledFixedCount = cVar9;
  fVar32 = (table->WorkRect).Min.x;
  fVar39 = table->OuterPaddingX + table->OuterPaddingX +
           (table->CellSpacingX1 + table->CellSpacingX2) * (float)(table->ColumnsEnabledCount + -1);
  if ((((uVar13 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar38 = (table->WorkRect).Max.x - fVar32;
  }
  else {
    fVar38 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar41 = (table->WorkRect).Min.y;
  fVar37 = (fVar38 - fVar39) - fVar37;
  fVar39 = (table->CellPaddingX + table->CellPaddingX) * (float)(int)table->ColumnsEnabledCount +
           fVar39;
  table->ColumnsGivenWidth = fVar39;
  fVar38 = fVar37;
  if (0 < (int)uVar19) {
    uVar27 = table->EnabledMaskByIndex;
    lVar22 = 0x55;
    uVar18 = 0;
    do {
      if ((uVar27 >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data;
        pIVar29 = (ImGuiTableColumn *)((long)pIVar28 + lVar22 + -0x55);
        if ((table->Columns).DataEnd <= pIVar29) goto LAB_0019759e;
        uVar12 = pIVar29->Flags;
        if ((uVar12 & 4) != 0) {
          auVar34 = ZEXT416((uint)(fVar37 * (*(float *)((long)pIVar28 + lVar22 + -0x3d) / fVar43)));
          auVar40 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar34,2);
          auVar40 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar34,auVar40);
          auVar40 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar40._0_4_ + 0.01)));
          *(float *)((long)pIVar28 + lVar22 + -0x45) = auVar40._0_4_;
          fVar38 = fVar38 - auVar40._0_4_;
        }
        if (*(char *)((long)&pIVar28->Flags + lVar22) == -1 && !bVar30) {
          pIVar29->Flags = uVar12 | 0x40000000;
        }
        auVar34 = ZEXT416(*(uint *)((long)pIVar28 + lVar22 + -0x45));
        auVar40 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar34,2);
        auVar40 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar34,auVar40);
        auVar36._0_4_ = (int)auVar40._0_4_;
        auVar36._4_4_ = (int)auVar40._4_4_;
        auVar36._8_4_ = (int)auVar40._8_4_;
        auVar36._12_4_ = (int)auVar40._12_4_;
        auVar40 = vcvtdq2ps_avx(auVar36);
        *(float *)((long)pIVar28 + lVar22 + -0x51) = auVar40._0_4_;
        fVar39 = fVar39 + auVar40._0_4_;
        table->ColumnsGivenWidth = fVar39;
      }
      uVar18 = uVar18 + 1;
      lVar22 = lVar22 + 0x68;
    } while (uVar26 != uVar18);
  }
  if ((((uVar13 >> 0x13 & 1) == 0) && (1.0 <= fVar38)) && ((0 < (int)uVar19 && (0.0 < fVar43)))) {
    uVar27 = table->EnabledMaskByDisplayOrder;
    do {
      uVar18 = uVar26 - 1;
      if ((uVar27 >> (uVar18 & 0x3f) & 1) != 0) {
        pcVar14 = (table->DisplayOrderToIndex).Data + uVar18;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_001975b5;
        lVar22 = (long)*pcVar14;
        if ((lVar22 < 0) ||
           (pIVar28 = (table->Columns).Data + lVar22, (table->Columns).DataEnd <= pIVar28))
        goto LAB_0019759e;
        if ((pIVar28->Flags & 4) != 0) {
          pIVar28->WidthRequest = pIVar28->WidthRequest + 1.0;
          pIVar28->WidthGiven = pIVar28->WidthGiven + 1.0;
          fVar38 = fVar38 + -1.0;
        }
      }
    } while ((1.0 <= fVar38) && (bVar30 = 1 < uVar26, uVar26 = uVar18, bVar30));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  local_40.Min = (table->OuterRect).Min;
  auVar35._8_8_ = 0;
  auVar35._0_4_ = local_40.Min.x;
  auVar35._4_4_ = local_40.Min.y;
  auVar40 = vmovshdup_avx(auVar35);
  auVar34 = ZEXT416((uint)(auVar40._0_4_ + table->LastOuterHeight));
  auVar36 = ZEXT416((uint)(table->OuterRect).Max.y);
  auVar40 = vcmpss_avx(auVar34,auVar36,2);
  auVar40 = vblendvps_avx(auVar34,auVar36,auVar40);
  local_40.Max.y = auVar40._0_4_;
  bVar10 = ItemHoverable(&local_40,0);
  bVar30 = '\0' < table->FreezeColumnsCount;
  fVar43 = fVar32;
  if ('\0' < table->FreezeColumnsCount) {
    fVar43 = (table->OuterRect).Min.x;
  }
  auVar46 = ZEXT464((uint)(table->InnerClipRect).Min.x);
  fVar37 = (table->InnerClipRect).Min.y;
  IVar1 = (table->InnerClipRect).Max;
  auVar44._8_8_ = 0;
  auVar44._0_4_ = IVar1.x;
  auVar44._4_4_ = IVar1.y;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar26 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
LAB_001973c2:
    if ((-1 < (long)table->RightMostEnabledColumn) &&
       (pIVar28 = (table->Columns).Data + table->RightMostEnabledColumn,
       pIVar28 < (table->Columns).DataEnd)) {
      auVar34 = ZEXT416((uint)(table->WorkRect).Min.x);
      auVar36 = ZEXT416((uint)(pIVar28->ClipRect).Max.x);
      auVar40 = vcmpss_avx(auVar36,auVar34,2);
      auVar40 = vblendvps_avx(auVar36,auVar34,auVar40);
      fVar32 = auVar40._0_4_;
      if ((bVar10) && ((table->HoveredColumnBody == -1 && (fVar32 <= (pIVar8->IO).MousePos.x)))) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar26;
      }
      uVar12 = table->Flags;
      if (!bVar11 && (uVar12 & 1) != 0) {
        uVar12 = uVar12 & 0xfffffffe;
        table->Flags = uVar12;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar12 = uVar12 & 0xfffeffff;
        table->Flags = uVar12;
      }
      if ((uVar12 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar32;
        (table->OuterRect).Max.x = fVar32;
        auVar40 = vminss_avx(ZEXT416((uint)(table->InnerClipRect).Max.x),auVar40);
        (table->InnerClipRect).Max.x = auVar40._0_4_;
      }
      pIVar3 = table->InnerWindow;
      IVar1 = (table->WorkRect).Max;
      (pIVar3->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar3->ParentWorkRect).Max = IVar1;
      fVar32 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar32;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar11 = BeginPopupEx(id,0x141);
        if (bVar11) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar12 = table->Flags;
      if (((byte)((uVar12 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar12 = table->Flags;
      }
      pIVar3 = table->InnerWindow;
      if ((uVar12 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar3->DrawList,(pIVar3->ClipRect).Min,(pIVar3->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar3->DrawList,2);
      }
      return;
    }
LAB_0019759e:
    pcVar14 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
  }
  else {
    auVar47 = ZEXT464((uint)((fVar43 + table->OuterPaddingX) - table->CellSpacingX1));
    auVar36 = vmovshdup_avx(auVar44);
    auVar40 = ZEXT416((uint)fVar41);
    auVar34 = vminss_avx(auVar36,auVar40);
    auVar40 = vcmpss_avx(auVar40,ZEXT416((uint)fVar37),1);
    auVar40 = vblendvps_avx(auVar34,ZEXT416((uint)fVar37),auVar40);
    auVar36 = vminss_avx(auVar36,SUB6416(ZEXT464(0x7f7fffff),0));
    auVar34 = vcmpss_avx(SUB6416(ZEXT464(0x7f7fffff),0),ZEXT416((uint)fVar37),1);
    auVar34 = vblendvps_avx(auVar36,ZEXT416((uint)fVar37),auVar34);
    fVar43 = IVar1.x;
    uVar27 = 0;
    iVar20 = 0;
    while (pbVar15 = (byte *)((table->DisplayOrderToIndex).Data + uVar27),
          pbVar15 < (table->DisplayOrderToIndex).DataEnd) {
      bVar17 = *pbVar15;
      if (((long)(char)bVar17 < 0) ||
         (pIVar28 = (table->Columns).Data + (char)bVar17, (table->Columns).DataEnd <= pIVar28))
      goto LAB_0019759e;
      bVar31 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar31 = (char)bVar17 < table->FreezeColumnsCount;
      }
      pIVar28->NavLayerCurrent = bVar31;
      if (bVar30) {
        bVar30 = true;
        if (iVar20 == table->FreezeColumnsCount) {
          auVar47 = ZEXT464((uint)(auVar47._0_4_ + (fVar32 - (table->OuterRect).Min.x)));
          goto LAB_001970c6;
        }
      }
      else {
LAB_001970c6:
        bVar30 = false;
      }
      pbVar15 = (byte *)((long)&pIVar28->Flags + 2);
      *pbVar15 = *pbVar15 & 0xf;
      fVar37 = auVar47._0_4_;
      auVar36 = auVar46._0_16_;
      local_a8 = auVar40._0_4_;
      local_b8._0_4_ = auVar34._0_4_;
      if ((table->EnabledMaskByDisplayOrder >> (uVar27 & 0x3f) & 1) == 0) {
        pIVar28->WorkMinX = fVar37;
        pIVar28->MaxX = fVar37;
        pIVar28->MinX = fVar37;
        pIVar28->WidthGiven = 0.0;
        auVar5 = vminss_avx(auVar44,auVar47._0_16_);
        auVar35 = vcmpss_avx(auVar47._0_16_,auVar36,1);
        auVar36 = vblendvps_avx(auVar5,auVar36,auVar35);
        auVar35 = vinsertps_avx(auVar36,ZEXT416(local_a8),0x10);
        auVar36 = vinsertps_avx(auVar36,ZEXT416((uint)local_b8._0_4_),0x10);
        IVar7 = (ImRect)vmovlhps_avx(auVar35,auVar36);
        pIVar28->ClipRect = IVar7;
        pIVar28->IsVisibleX = false;
        pIVar28->IsVisibleY = false;
        pIVar28->IsRequestOutput = false;
        pIVar28->IsSkipItems = true;
        pIVar28->ItemWidth = 1.0;
      }
      else {
        if (((bVar10) && (fVar39 = (pIVar8->IO).MousePos.x, (pIVar28->ClipRect).Min.x <= fVar39)) &&
           (fVar39 < (pIVar28->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar17;
        }
        pIVar28->MinX = fVar37;
        auVar47._0_4_ = TableGetMaxColumnWidth(table,(int)(char)bVar17);
        auVar47._4_60_ = extraout_var;
        auVar5 = vminss_avx(ZEXT416((uint)pIVar28->WidthGiven),auVar47._0_16_);
        auVar6 = vminss_avx(ZEXT416((uint)pIVar28->WidthRequest),
                            ZEXT416((uint)table->MinColumnWidth));
        auVar35 = vcmpss_avx(auVar6,auVar5,2);
        auVar35 = vblendvps_avx(auVar6,auVar5,auVar35);
        fVar33 = auVar35._0_4_;
        pIVar28->WidthGiven = fVar33;
        fVar39 = table->CellPaddingX;
        fVar38 = table->CellSpacingX1;
        fVar41 = table->CellSpacingX2;
        fVar4 = fVar39 + fVar39 + fVar41 + fVar38 + fVar37 + fVar33;
        pIVar28->MaxX = fVar4;
        fVar38 = fVar38 + fVar39 + pIVar28->MinX;
        pIVar28->WorkMinX = fVar38;
        pIVar28->WorkMaxX = (fVar4 - fVar39) - fVar41;
        auVar35 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar33 * 0.65)));
        pIVar28->ItemWidth = auVar35._0_4_;
        auVar5 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)pIVar28->MinX),0x10);
        uVar45 = auVar46._0_4_;
        auVar42._4_4_ = uVar45;
        auVar42._0_4_ = uVar45;
        auVar42._8_4_ = uVar45;
        auVar42._12_4_ = uVar45;
        auVar35 = vcmpps_avx(auVar5,auVar42,1);
        auVar6._4_4_ = fVar43;
        auVar6._0_4_ = fVar43;
        auVar6._8_4_ = fVar43;
        auVar6._12_4_ = fVar43;
        auVar5 = vminps_avx(auVar6,auVar5);
        auVar35 = vblendvps_avx(auVar5,auVar42,auVar35);
        auVar42 = vmovshdup_avx(auVar35);
        auVar5 = vinsertps_avx(auVar42,ZEXT416(local_a8),0x10);
        auVar6 = vinsertps_avx(auVar35,ZEXT416((uint)local_b8._0_4_),0x10);
        IVar7 = (ImRect)vmovlhps_avx(auVar5,auVar6);
        pIVar28->ClipRect = IVar7;
        fVar39 = auVar35._0_4_;
        fVar41 = auVar42._0_4_;
        pIVar28->IsVisibleX = fVar41 < fVar39;
        pIVar28->IsVisibleY = true;
        if (fVar39 <= fVar41) {
          if (pIVar28->AutoFitQueue != '\0') goto LAB_001972b1;
          bVar31 = pIVar28->CannotSkipItemsQueue != '\0';
          pIVar28->IsRequestOutput = bVar31;
          if (bVar31) goto LAB_001972c0;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar17 & 0x3f);
LAB_001972b1:
          pIVar28->IsRequestOutput = true;
LAB_001972c0:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar17 & 0x3f);
        }
        bVar31 = true;
        if (pIVar28->IsEnabled == true) {
          bVar31 = table->HostSkipItems;
        }
        pIVar28->IsSkipItems = bVar31;
        if ((bVar31 & fVar41 < fVar39) == 1) {
          __assert_fail("!is_visible",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x3e1,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        uVar12 = (uint)(fVar41 < fVar39) << 0x15 | pIVar28->Flags;
        uVar13 = uVar12 | 0x100000;
        pIVar28->Flags = uVar13;
        if (pIVar28->SortOrder != -1) {
          uVar13 = uVar12 | 0x500000;
          pIVar28->Flags = uVar13;
        }
        if (table->HoveredColumnBody == bVar17) {
          pIVar28->Flags = uVar13 | 0x800000;
        }
        pIVar28->ContentMaxXFrozen = fVar38;
        pIVar28->ContentMaxXUnfrozen = fVar38;
        pIVar28->ContentMaxXHeadersUsed = fVar38;
        pIVar28->ContentMaxXHeadersIdeal = fVar38;
        if (table->HostSkipItems == false) {
          pIVar28->AutoFitQueue = pIVar28->AutoFitQueue >> 1;
          pIVar28->CannotSkipItemsQueue = pIVar28->CannotSkipItemsQueue >> 1;
        }
        if (iVar20 < table->FreezeColumnsCount) {
          auVar5 = vminss_avx(auVar44,ZEXT416((uint)(fVar4 + 1.0)));
          auVar35 = vcmpss_avx(ZEXT416((uint)(fVar4 + 1.0)),auVar36,1);
          auVar36 = vblendvps_avx(auVar5,auVar36,auVar35);
        }
        auVar46 = ZEXT1664(auVar36);
        auVar47 = ZEXT464((uint)(fVar37 + table->CellPaddingX + table->CellPaddingX +
                                          fVar33 + table->CellSpacingX1 + table->CellSpacingX2));
        iVar20 = iVar20 + 1;
      }
      uVar27 = uVar27 + 1;
      uVar26 = (ulong)table->ColumnsCount;
      if ((long)uVar26 <= (long)uVar27) goto LAB_001973c2;
    }
LAB_001975b5:
    pcVar14 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x216,pcVar14);
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}